

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

void WebRtcIsac_Lar2Poly(double *lars,double *lowband,int orderLo,double *hiband,int orderHi,
                        int Nsub)

{
  double *local_370;
  double *inp;
  double *outph;
  double *outpl;
  double rc [100];
  int orderTot;
  int k;
  int Nsub_local;
  int orderHi_local;
  double *hiband_local;
  int orderLo_local;
  double *lowband_local;
  double *lars_local;
  
  rc[99]._0_4_ = orderLo + orderHi + 2;
  local_370 = lars;
  inp = hiband;
  outph = lowband;
  for (rc[99]._4_4_ = 0; rc[99]._4_4_ < Nsub; rc[99]._4_4_ = rc[99]._4_4_ + 1) {
    WebRtcIsac_Lar2Rc(local_370 + 2,(double *)&outpl,orderLo);
    WebRtcIsac_Rc2Poly((double *)&outpl,orderLo,outph);
    WebRtcIsac_Lar2Rc(local_370 + (orderLo + 2),(double *)&outpl,orderHi);
    WebRtcIsac_Rc2Poly((double *)&outpl,orderHi,inp);
    *outph = *local_370;
    *inp = local_370[1];
    outph = outph + (orderLo + 1);
    inp = inp + (orderHi + 1);
    local_370 = local_370 + rc[99]._0_4_;
  }
  return;
}

Assistant:

void WebRtcIsac_Lar2Poly(double* lars, double* lowband, int orderLo,
                         double* hiband, int orderHi, int Nsub) {
  int k, orderTot;
  double rc[MAX_ORDER], *outpl, *outph, *inp;

  orderTot = (orderLo + orderHi + 2);
  outpl = lowband;
  outph = hiband;
  /* First two elements of 'inp' store gains*/
  inp = lars;
  for (k = 0; k < Nsub; k++) {
    /* Low band */
    WebRtcIsac_Lar2Rc(&inp[2], rc, orderLo);
    WebRtcIsac_Rc2Poly(rc, orderLo, outpl);

    /* High band */
    WebRtcIsac_Lar2Rc(&inp[orderLo + 2], rc, orderHi);
    WebRtcIsac_Rc2Poly(rc, orderHi, outph);

    /* gains */
    outpl[0] = inp[0];
    outph[0] = inp[1];

    outpl += orderLo + 1;
    outph += orderHi + 1;
    inp += orderTot;
  }
}